

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qundostack.cpp
# Opt level: O1

bool __thiscall QUndoStackPrivate::checkUndoLimit(QUndoStackPrivate *this)

{
  QUndoCommand ***pppQVar1;
  qsizetype *pqVar2;
  ulong uVar3;
  QUndoCommand *pQVar4;
  bool bVar5;
  iterator iVar6;
  int iVar7;
  int iVar8;
  int iVar9;
  
  iVar9 = this->undo_limit;
  if (0 < (long)iVar9) {
    if (((this->macro_stack).d.size == 0) &&
       (uVar3 = (this->command_list).d.size, (ulong)(long)iVar9 < uVar3)) {
      iVar9 = (int)uVar3 - iVar9;
      if (0 < iVar9) {
        iVar8 = iVar9;
        do {
          iVar6 = QList<QUndoCommand_*>::begin(&this->command_list);
          pQVar4 = *iVar6.i;
          pppQVar1 = &(this->command_list).d.ptr;
          *pppQVar1 = *pppQVar1 + 1;
          pqVar2 = &(this->command_list).d.size;
          *pqVar2 = *pqVar2 + -1;
          if (pQVar4 != (QUndoCommand *)0x0) {
            (*pQVar4->_vptr_QUndoCommand[1])();
          }
          iVar8 = iVar8 + -1;
        } while (iVar8 != 0);
      }
      this->index = this->index - iVar9;
      iVar8 = this->clean_index;
      bVar5 = true;
      if (iVar8 != -1) {
        iVar7 = -1;
        if (iVar9 <= iVar8) {
          iVar7 = iVar8 - iVar9;
        }
        this->clean_index = iVar7;
      }
    }
    else {
      bVar5 = false;
    }
    return bVar5;
  }
  return false;
}

Assistant:

bool QUndoStackPrivate::checkUndoLimit()
{
    if (undo_limit <= 0 || !macro_stack.isEmpty() || undo_limit >= command_list.size())
        return false;

    int del_count = command_list.size() - undo_limit;

    for (int i = 0; i < del_count; ++i)
        delete command_list.takeFirst();

    index -= del_count;
    if (clean_index != -1) {
        if (clean_index < del_count)
            clean_index = -1; // we've deleted the clean command
        else
            clean_index -= del_count;
    }

    return true;
}